

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O2

uint8_t * bson_destroy_with_steal(bson_t *bson,_Bool steal,uint32_t *length)

{
  uint8_t *__dest;
  bson_impl_alloc_t *alloc;
  
  if (bson != (bson_t *)0x0) {
    if (length != (uint32_t *)0x0) {
      *length = bson->len;
    }
    if ((steal) && ((bson->flags & 0x1c) == 0)) {
      if ((bson->flags & 1) == 0) {
        __dest = (uint8_t *)**(undefined8 **)(bson->padding + 0x10);
        **(undefined8 **)(bson->padding + 0x10) = 0;
      }
      else {
        __dest = (uint8_t *)bson_malloc((ulong)bson->len);
        memcpy(__dest,bson->padding,(ulong)bson->len);
      }
    }
    else {
      __dest = (uint8_t *)0x0;
    }
    bson_destroy(bson);
    return __dest;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson.c",
          0x93d,"bson_destroy_with_steal","bson");
  abort();
}

Assistant:

uint8_t *
bson_destroy_with_steal (bson_t *bson, bool steal, uint32_t *length)
{
   uint8_t *ret = NULL;

   BSON_ASSERT (bson);

   if (length) {
      *length = bson->len;
   }

   if (!steal) {
      bson_destroy (bson);
      return NULL;
   }

   if ((bson->flags &
        (BSON_FLAG_CHILD | BSON_FLAG_IN_CHILD | BSON_FLAG_RDONLY))) {
      /* Do nothing */
   } else if ((bson->flags & BSON_FLAG_INLINE)) {
      bson_impl_inline_t *inl;

      inl = (bson_impl_inline_t *) bson;
      ret = bson_malloc (bson->len);
      memcpy (ret, inl->data, bson->len);
   } else {
      bson_impl_alloc_t *alloc;

      alloc = (bson_impl_alloc_t *) bson;
      ret = *alloc->buf;
      *alloc->buf = NULL;
   }

   bson_destroy (bson);

   return ret;
}